

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O3

void Omega_h::classify_equal_order(Mesh *mesh,Int ent_dim,LOs *eqv2v,Read<int> *eq_class_ids)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Omega_h_Family family;
  Alloc *pAVar3;
  LOs *pLVar4;
  undefined8 uVar5;
  LO LVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  size_t sVar8;
  Alloc *pAVar9;
  bool bVar10;
  bool bVar11;
  Read<signed_char> eq_class_dim;
  Adj v2e;
  Read<int> class_id;
  Read<signed_char> class_dim;
  Write<int> local_198;
  Omega_h *local_180;
  Adj local_178;
  Alloc *local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  undefined1 local_138 [16];
  Write<signed_char> local_128;
  Omega_h *local_110;
  LOs local_108;
  Read<int> local_f8;
  LOs local_e8;
  Read<signed_char> local_d8;
  LOs local_c8;
  LOs local_b8;
  Read<int> local_a8;
  Read<signed_char> local_98;
  Write<int> local_88;
  Read<signed_char> local_78;
  Adj local_60;
  
  local_148 = (Alloc *)0x0;
  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_180 = (Omega_h *)eq_class_ids;
  if (3 < (uint)mesh->dim_) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  if (mesh->dim_ == ent_dim) {
    LVar6 = Mesh::nelems(mesh);
    pLVar4 = &local_178.super_Graph.ab2b;
    local_178.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)pLVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
    Read<int>::Read((Read<int> *)&local_198,LVar6,0,1,(string *)&local_178);
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.shared_alloc_.direct_ptr;
    local_148 = local_198.shared_alloc_.alloc;
    p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.shared_alloc_.direct_ptr
    ;
    if ((((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
         local_198.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_198.shared_alloc_.alloc)->use_count = (local_198.shared_alloc_.alloc)->use_count + -1;
      local_148 = (Alloc *)((local_198.shared_alloc_.alloc)->size * 8 + 1);
    }
    pAVar9 = local_148;
    local_198.shared_alloc_.alloc = (Alloc *)0x0;
    local_198.shared_alloc_.direct_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (local_178.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)pLVar4) {
      operator_delete(local_178.super_Graph.a2ab.write_.shared_alloc_.alloc,
                      (ulong)((long)&(local_178.super_Graph.ab2b.write_.shared_alloc_.alloc)->size +
                             1));
    }
  }
  else if (ent_dim == 0) {
    local_148 = (eqv2v->write_).shared_alloc_.alloc;
    if (((ulong)local_148 & 7) == 0 && local_148 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_148 = (Alloc *)(local_148->size * 8 + 1);
      }
      else {
        local_148->use_count = local_148->use_count + 1;
      }
    }
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (eqv2v->write_).shared_alloc_.direct_ptr;
    pAVar9 = local_148;
    p_Stack_140 = p_Var7;
  }
  else {
    local_198.shared_alloc_.alloc = (Alloc *)0x0;
    local_198.shared_alloc_.direct_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_128.shared_alloc_.alloc = (Alloc *)0x0;
    local_128.shared_alloc_.direct_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Mesh::ask_verts_of((Mesh *)local_138,(Int)mesh);
    Mesh::ask_up(&local_178,mesh,0,ent_dim);
    family = mesh->family_;
    local_b8.write_.shared_alloc_.alloc = (eqv2v->write_).shared_alloc_.alloc;
    if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_b8.write_.shared_alloc_.alloc =
             (Alloc *)((local_b8.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_b8.write_.shared_alloc_.alloc)->use_count =
             (local_b8.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_b8.write_.shared_alloc_.direct_ptr = (eqv2v->write_).shared_alloc_.direct_ptr;
    local_c8.write_.shared_alloc_.alloc = (Alloc *)local_138._0_8_;
    if ((local_138._0_8_ & 7) == 0 && (Alloc *)local_138._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_c8.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_138._0_8_ * 8 + 1);
      }
      else {
        *(int *)(local_138._0_8_ + 0x30) = *(int *)(local_138._0_8_ + 0x30) + 1;
      }
    }
    local_c8.write_.shared_alloc_.direct_ptr = (void *)local_138._8_8_;
    local_60.super_Graph.a2ab.write_.shared_alloc_.alloc =
         local_178.super_Graph.a2ab.write_.shared_alloc_.alloc;
    if (((ulong)local_178.super_Graph.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
        local_178.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.super_Graph.a2ab.write_.shared_alloc_.alloc =
             (Alloc *)((local_178.super_Graph.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_178.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count =
             (local_178.super_Graph.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.super_Graph.a2ab.write_.shared_alloc_.direct_ptr =
         local_178.super_Graph.a2ab.write_.shared_alloc_.direct_ptr;
    local_60.super_Graph.ab2b.write_.shared_alloc_.alloc =
         local_178.super_Graph.ab2b.write_.shared_alloc_.alloc;
    if (((ulong)local_178.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
        local_178.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.super_Graph.ab2b.write_.shared_alloc_.alloc =
             (Alloc *)((local_178.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_178.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
             (local_178.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
         local_178.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_60.codes.write_.shared_alloc_.alloc = local_178.codes.write_.shared_alloc_.alloc;
    if (((ulong)local_178.codes.write_.shared_alloc_.alloc & 7) == 0 &&
        local_178.codes.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_60.codes.write_.shared_alloc_.alloc =
             (Alloc *)((local_178.codes.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_178.codes.write_.shared_alloc_.alloc)->use_count =
             (local_178.codes.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_60.codes.write_.shared_alloc_.direct_ptr = local_178.codes.write_.shared_alloc_.direct_ptr
    ;
    find_matches(family,ent_dim,&local_b8,&local_c8,&local_60,&local_198,&local_128);
    Adj::~Adj(&local_60);
    pAVar9 = local_c8.write_.shared_alloc_.alloc;
    if (((ulong)local_c8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_c8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_c8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_c8.write_.shared_alloc_.alloc);
        operator_delete(pAVar9,0x48);
      }
    }
    pAVar9 = local_b8.write_.shared_alloc_.alloc;
    if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_b8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
        operator_delete(pAVar9,0x48);
      }
    }
    local_88.shared_alloc_.alloc = local_198.shared_alloc_.alloc;
    if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
        local_198.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_88.shared_alloc_.alloc = (Alloc *)((local_198.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_198.shared_alloc_.alloc)->use_count = (local_198.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_88.shared_alloc_.direct_ptr = local_198.shared_alloc_.direct_ptr;
    Read<int>::Read(&local_78,&local_88);
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_78.write_.shared_alloc_.direct_ptr;
    pAVar3 = local_88.shared_alloc_.alloc;
    local_148 = local_78.write_.shared_alloc_.alloc;
    p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  local_78.write_.shared_alloc_.direct_ptr;
    if ((((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
         local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_78.write_.shared_alloc_.alloc)->use_count =
           (local_78.write_.shared_alloc_.alloc)->use_count + -1;
      local_148 = (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    pAVar9 = local_148;
    local_78.write_.shared_alloc_.alloc = (Alloc *)0x0;
    local_78.write_.shared_alloc_.direct_ptr = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (((ulong)local_88.shared_alloc_.alloc & 7) == 0 &&
        local_88.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_88.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_88.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    Adj::~Adj(&local_178);
    uVar5 = local_138._0_8_;
    if ((local_138._0_8_ & 7) == 0 && (Alloc *)local_138._0_8_ != (Alloc *)0x0) {
      piVar1 = (int *)(local_138._0_8_ + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_138._0_8_);
        operator_delete((void *)uVar5,0x48);
      }
    }
    pAVar3 = local_128.shared_alloc_.alloc;
    if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
        local_128.shared_alloc_.alloc != (Alloc *)0x0) {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_128.shared_alloc_.alloc + 0x30);
      *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
      if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
        Alloc::~Alloc(local_128.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_198.shared_alloc_.alloc;
    if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
        local_198.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_198.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_198.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
  }
  pAVar3 = (eqv2v->write_).shared_alloc_.alloc;
  if (((ulong)pAVar3 & 1) == 0) {
    sVar8 = pAVar3->size;
  }
  else {
    sVar8 = (ulong)pAVar3 >> 3;
  }
  pLVar4 = &local_178.super_Graph.ab2b;
  local_178.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)pLVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
  Read<signed_char>::Read
            ((Read<signed_char> *)&local_198,
             (LO)((long)((ulong)(uint)((int)(sVar8 >> 2) >> 0x1f) << 0x20 | sVar8 >> 2 & 0xffffffff)
                 / (long)(ent_dim + 1)),(char)ent_dim,(string *)&local_178);
  if (local_178.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)pLVar4) {
    operator_delete(local_178.super_Graph.a2ab.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_178.super_Graph.ab2b.write_.shared_alloc_.alloc)->size + 1
                           ));
  }
  local_d8.write_.shared_alloc_.alloc = local_198.shared_alloc_.alloc;
  if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
      local_198.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_d8.write_.shared_alloc_.alloc = (Alloc *)((local_198.shared_alloc_.alloc)->size * 8 + 1)
      ;
    }
    else {
      (local_198.shared_alloc_.alloc)->use_count = (local_198.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_d8.write_.shared_alloc_.direct_ptr = local_198.shared_alloc_.direct_ptr;
  bVar10 = pAVar9 != (Alloc *)0x0;
  bVar11 = ((ulong)pAVar9 & 7) == 0;
  local_e8.write_.shared_alloc_.alloc = pAVar9;
  if (bVar11 && bVar10) {
    if (entering_parallel == '\x01') {
      local_e8.write_.shared_alloc_.alloc = (Alloc *)(pAVar9->size * 8 + 1);
    }
    else {
      pAVar9->use_count = pAVar9->use_count + 1;
    }
  }
  local_e8.write_.shared_alloc_.direct_ptr = p_Var7;
  LVar6 = Mesh::nents(mesh,ent_dim);
  if (3 < (uint)mesh->dim_) {
    fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
         ,0x33);
  }
  local_110 = (Omega_h *)&local_128;
  map_onto<signed_char>(local_110,&local_d8,&local_e8,LVar6,(char)mesh->dim_,1);
  pAVar3 = local_e8.write_.shared_alloc_.alloc;
  if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_e8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_e8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_e8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_d8.write_.shared_alloc_.alloc;
  if (((ulong)local_d8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_d8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_d8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_d8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_f8.write_.shared_alloc_.alloc = (((Write<int> *)&local_180->field_0x0)->shared_alloc_).alloc
  ;
  if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_f8.write_.shared_alloc_.alloc =
           (Alloc *)((local_f8.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_f8.write_.shared_alloc_.alloc)->use_count =
           (local_f8.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_f8.write_.shared_alloc_.direct_ptr =
       (((Write<int> *)&local_180->field_0x0)->shared_alloc_).direct_ptr;
  local_108.write_.shared_alloc_.alloc = pAVar9;
  if (bVar11 && bVar10) {
    if (entering_parallel == '\x01') {
      local_108.write_.shared_alloc_.alloc = (Alloc *)(pAVar9->size * 8 + 1);
    }
    else {
      pAVar9->use_count = pAVar9->use_count + 1;
    }
  }
  local_108.write_.shared_alloc_.direct_ptr = p_Var7;
  LVar6 = Mesh::nents(mesh,ent_dim);
  local_180 = (Omega_h *)local_138;
  map_onto<int>(local_180,&local_f8,&local_108,LVar6,-1,1);
  pAVar3 = local_108.write_.shared_alloc_.alloc;
  pLVar4 = &local_178.super_Graph.ab2b;
  if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
      local_108.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_108.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_108.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_f8.write_.shared_alloc_.alloc;
  if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_f8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_f8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_f8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_178.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)pLVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"class_dim","");
  local_98.write_.shared_alloc_.alloc = local_128.shared_alloc_.alloc;
  if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
      local_128.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc =
           (Alloc *)((long)(local_128.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)local_128.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base =
           *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)local_128.shared_alloc_.alloc + 0x30))->_vptr__Sp_counted_base + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = local_128.shared_alloc_.direct_ptr;
  Mesh::add_tag<signed_char>(mesh,ent_dim,(string *)&local_178,1,&local_98,false);
  pAVar3 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (local_178.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)pLVar4) {
    operator_delete(local_178.super_Graph.a2ab.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_178.super_Graph.ab2b.write_.shared_alloc_.alloc)->size + 1
                           ));
  }
  local_178.super_Graph.a2ab.write_.shared_alloc_.alloc = (Alloc *)pLVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"class_id","");
  local_a8.write_.shared_alloc_.alloc = (Alloc *)local_138._0_8_;
  if ((local_138._0_8_ & 7) == 0 && (Alloc *)local_138._0_8_ != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8.write_.shared_alloc_.alloc = (Alloc *)(*(size_t *)local_138._0_8_ * 8 + 1);
    }
    else {
      *(int *)(local_138._0_8_ + 0x30) = *(int *)(local_138._0_8_ + 0x30) + 1;
    }
  }
  local_a8.write_.shared_alloc_.direct_ptr = (void *)local_138._8_8_;
  Mesh::add_tag<int>(mesh,ent_dim,(string *)&local_178,1,&local_a8,false);
  pAVar3 = local_a8.write_.shared_alloc_.alloc;
  if (((ulong)local_a8.write_.shared_alloc_.alloc & 7) == 0 &&
      local_a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_a8.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_a8.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (local_178.super_Graph.a2ab.write_.shared_alloc_.alloc != (Alloc *)pLVar4) {
    operator_delete(local_178.super_Graph.a2ab.write_.shared_alloc_.alloc,
                    (ulong)((long)&(local_178.super_Graph.ab2b.write_.shared_alloc_.alloc)->size + 1
                           ));
  }
  if ((local_138._0_8_ & 7) == 0 && (Alloc *)local_138._0_8_ != (Alloc *)0x0) {
    piVar1 = (int *)(local_138._0_8_ + 0x30);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc((Alloc *)local_138._0_8_);
      operator_delete((void *)local_138._0_8_,0x48);
    }
  }
  pAVar3 = local_128.shared_alloc_.alloc;
  if (((ulong)local_128.shared_alloc_.alloc & 7) == 0 &&
      local_128.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_128.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var7->_vptr__Sp_counted_base = *(int *)&p_Var7->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var7->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_128.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_198.shared_alloc_.alloc;
  if (((ulong)local_198.shared_alloc_.alloc & 7) == 0 &&
      local_198.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_198.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_198.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (bVar11 && bVar10) {
    piVar1 = &pAVar9->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(pAVar9);
      operator_delete(pAVar9,0x48);
    }
  }
  return;
}

Assistant:

void classify_equal_order(
    Mesh* mesh, Int ent_dim, LOs eqv2v, Read<ClassId> eq_class_ids) {
  LOs eq2e;
  if (ent_dim == mesh->dim()) {
    /* assuming elements were constructed in the same order ! */
    eq2e = LOs(mesh->nelems(), 0, 1);
  } else if (ent_dim == VERT) {
    eq2e = eqv2v;
  } else {
    Write<LO> eq2e_w;
    Write<I8> codes;
    auto ev2v = mesh->ask_verts_of(ent_dim);
    auto v2e = mesh->ask_up(VERT, ent_dim);
    find_matches(mesh->family(), ent_dim, eqv2v, ev2v, v2e, &eq2e_w, &codes);
    eq2e = eq2e_w;
  }
  auto neq = eqv2v.size() / (ent_dim + 1);
  auto eq_class_dim = Read<I8>(neq, I8(ent_dim));
  auto class_dim =
      map_onto(eq_class_dim, eq2e, mesh->nents(ent_dim), I8(mesh->dim()), 1);
  auto class_id = map_onto(eq_class_ids, eq2e, mesh->nents(ent_dim), -1, 1);
  mesh->add_tag<I8>(ent_dim, "class_dim", 1, class_dim);
  mesh->add_tag<ClassId>(ent_dim, "class_id", 1, class_id);
}